

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O3

void animate(tgestate_t *state)

{
  byte bVar1;
  spriteindex_t sprite_index;
  undefined2 uVar2;
  anim_t *paVar3;
  byte bVar4;
  int iVar5;
  animframe_t *paVar6;
  char cVar7;
  vischar_t *vischar;
  
  vischar = state->vischars;
  state->IY = vischar;
  cVar7 = -8;
  do {
    if (vischar->flags != 0xff) {
      vischar->flags = vischar->flags | 0x80;
      bVar4 = vischar->input;
      if ((char)bVar4 < '\0') {
        bVar4 = bVar4 & 0x7f;
        vischar->input = bVar4;
LAB_00105a59:
        bVar4 = animate::animindices[vischar->direction][bVar4];
        paVar3 = vischar->animbase[bVar4 & 0x7f];
        vischar->anim = paVar3;
        if (-1 < (char)bVar4) {
          vischar->animindex = '\0';
          vischar->direction = paVar3->to;
          goto LAB_00105a91;
        }
        bVar4 = paVar3->nframes;
        vischar->animindex = bVar4 - 1 | 0x80;
        vischar->direction = paVar3->from;
        paVar6 = paVar3->frames + ((ulong)bVar4 - 1);
LAB_00105b00:
        sprite_index = paVar6->spriteindex;
        uVar2 = (vischar->mi).mappos.u;
        (state->saved_mappos).pos16.u = uVar2 - (short)paVar6->dx;
        (state->saved_mappos).pos16.v = (vischar->mi).mappos.v - (short)paVar6->dy;
        (state->saved_mappos).pos16.w =
             (short)*(undefined4 *)&(vischar->mi).mappos.w - (short)paVar6->dh;
        iVar5 = touch(state,vischar,sprite_index);
        if (iVar5 == 0) {
          vischar->animindex = vischar->animindex - 1 | 0x80;
          goto LAB_00105b52;
        }
      }
      else {
        paVar3 = vischar->anim;
        bVar1 = vischar->animindex;
        if ((char)bVar1 < '\0') {
          if ((ulong)(bVar1 & 0x7f) == 0x7f) goto LAB_00105a59;
          paVar6 = paVar3->frames + (bVar1 & 0x7f);
          goto LAB_00105b00;
        }
        if (bVar1 == paVar3->nframes) goto LAB_00105a59;
        paVar3 = (anim_t *)(paVar3->frames + ((ulong)bVar1 - 1));
LAB_00105a91:
        (state->saved_mappos).pos16.u = (short)paVar3->frames[0].dx + (vischar->mi).mappos.u;
        (state->saved_mappos).pos16.v = (short)paVar3->frames[0].dy + (vischar->mi).mappos.v;
        (state->saved_mappos).pos16.w = (short)paVar3->frames[0].dh + (vischar->mi).mappos.w;
        iVar5 = touch(state,vischar,paVar3->frames[0].spriteindex);
        if (iVar5 == 0) {
          vischar->animindex = vischar->animindex + '\x01';
LAB_00105b52:
          (vischar->isopos).x =
               ((state->saved_mappos).pos16.v - (state->saved_mappos).pos16.u) * 2 + 0x400;
          (vischar->isopos).y =
               0x800 - ((state->saved_mappos).pos16.u + (state->saved_mappos).pos16.v +
                       (state->saved_mappos).pos16.w);
        }
      }
      if (vischar->flags != 0xff) {
        vischar->flags = vischar->flags & 0x7f;
      }
    }
    vischar = state->IY + 1;
    state->IY = vischar;
    cVar7 = cVar7 + '\x01';
    if (cVar7 == '\0') {
      return;
    }
  } while( true );
}

Assistant:

void animate(tgestate_t *state)
{
  /* The most common animations use the forward case, but the game will also
   * play some animations backwards when required. For example when crawling
   * in straight tunnels the hero cannot turn around. Moving in the opposite
   * direction doesn't turn the character around but instead plays the same
   * crawl animation but in reverse mode.
   */

  /**
   * $CDAA: Maps a character's direction and user input to an animation index
   * and reverse flag.
   *
   * The horizontal axis is input (U/D/L/R = Up/Down/Left/Right)
   * and the vertical axis is direction (TL/TR/BR/BL + crawl flag).
   *
   * For example:
   * if (direction,input) is (TL, None) then index is 8 which is anim_wait_tl.
   * if (direction,input) is (TR + Crawl, D+L) then index is 21 which is anim_crawlwait_tr.
   *
   * Modulo the reverse flag the highest index in the table is 23 which is
   * the max index in animations[] (== animations__LIMIT - 1).
   */
  static const uint8_t animindices[8 /*direction*/][9 /*input*/] =
  {
#define F (0 << 7) /* Top bit set: animation plays forwards. */
#define R (1 << 7) /* Top bit clear: animation plays in reverse. */
    /* None,   U,    D,    L,  U+L,  D+L,    R,  U+R,  D+R */
    {  8|F,  0|F,  4|F,  7|R,  0|F,  7|R,  4|F,  4|F,  4|F }, /* TL */
    {  9|F,  4|R,  5|F,  5|F,  4|R,  5|F,  1|F,  1|F,  5|F }, /* TR */
    { 10|F,  5|R,  2|F,  6|F,  5|R,  6|F,  5|R,  5|R,  2|F }, /* BR */
    { 11|F,  7|F,  6|R,  3|F,  7|F,  3|F,  7|F,  7|F,  6|R }, /* BL */
    { 20|F, 12|F, 12|R, 19|R, 12|F, 19|R, 16|F, 16|F, 12|R }, /* TL + Crawl */
    { 21|F, 16|R, 17|F, 13|R, 16|R, 21|R, 13|F, 13|F, 17|F }, /* TR + Crawl */
    { 22|F, 14|R, 14|F, 18|F, 14|R, 14|F, 17|R, 17|R, 14|F }, /* BR + Crawl */
    { 23|F, 19|F, 18|R, 15|F, 19|F, 15|F, 15|R, 15|R, 18|R }, /* BL + Crawl */
  };

  uint8_t            iters;         /* was B */
  const anim_t      *animA;         /* was HL */
  const animframe_t *frameA;        /* was HL */
  uint8_t            animindex;     /* was A */
  spriteindex_t      spriteindex;   /* was A */
  uint8_t            newanimindex;  /* was C */
  uint8_t            length;        /* was C */
  const anim_t      *animB;         /* was DE */
  const animframe_t *frameB;        /* was DE */
  spriteindex_t      spriteindex2;  /* was A' */
  vischar_t         *vischar;       /* a cache of IY (Conv: added) */

  assert(state != NULL);

  frameA = frameB = NULL; // Conv: init
  spriteindex2 = 0; // Conv: initialise

  /* Animate all vischars. */
  iters     = vischars_LENGTH;
  state->IY = &state->vischars[0];
  do
  {
    vischar = state->IY; /* Conv: Added local copy of IY. */
    if (vischar->flags == vischar_FLAGS_EMPTY_SLOT)
      goto next;

    assert((vischar->input & ~input_KICK) < 9);

    vischar->flags |= vischar_FLAGS_NO_COLLIDE;

    if (vischar->input & input_KICK)
      goto kicked; /* force an update */

    assert(vischar->input < 9);

    animA = vischar->anim;
    animindex = vischar->animindex;
    if (animindex & vischar_ANIMINDEX_REVERSE)
    {
      /* Reached end of animation? */
      /* BUG FIX: Checks for 0x7F, not 0. */
      animindex &= ~vischar_ANIMINDEX_REVERSE;
      if (animindex == 0x7F) /* i.e. -1 */
        goto init;

      assert(animindex < animA->nframes);

      frameA = &animA->frames[animindex];
      spriteindex = frameA->spriteindex;

      SWAP(uint8_t, spriteindex, spriteindex2);

backwards:
      SWAP(const animframe_t *, frameB, frameA);

      state->saved_mappos.pos16.u = vischar->mi.mappos.u - frameB->dx;
      state->saved_mappos.pos16.v = vischar->mi.mappos.v - frameB->dy;
      state->saved_mappos.pos16.w = vischar->mi.mappos.w - frameB->dh;

      if (touch(state, vischar, spriteindex2))
        goto pop_next; /* don't animate if collided */

      /* Conv: Preserve reverse flag. */
      vischar->animindex = (vischar->animindex - 1) | vischar_ANIMINDEX_REVERSE;
    }
    else
    {
      /* Reached end of animation? */
      if (animindex == animA->nframes)
        goto init;

      assert(animindex < animA->nframes);

      frameA = &animA->frames[animindex];

forwards:
      SWAP(const animframe_t *, frameB, frameA);

      state->saved_mappos.pos16.u = vischar->mi.mappos.u + frameB->dx;
      state->saved_mappos.pos16.v = vischar->mi.mappos.v + frameB->dy;
      state->saved_mappos.pos16.w = vischar->mi.mappos.w + frameB->dh;
      spriteindex = frameB->spriteindex;

      SWAP(uint8_t, spriteindex, spriteindex2);

      if (touch(state, vischar, spriteindex2))
        goto pop_next; /* don't animate if collided */

      vischar->animindex++;
    }

    calc_vischar_isopos_from_state(state, vischar);

pop_next:
    if (vischar->flags != vischar_FLAGS_EMPTY_SLOT)
      vischar->flags &= ~vischar_FLAGS_NO_COLLIDE; // $8001

next:
    state->IY++;
  }
  while (--iters);

  return;


kicked:
  vischar->input &= ~input_KICK;
  assert(vischar->input < 9);
  /* fall through */
init:
  assert(vischar->input < 9);
  assert(vischar->direction < 8);
  newanimindex = animindices[vischar->direction][vischar->input];
  /* Conv: Original game uses ADD A,A to double A and in doing so discards
   * the top flag bit. We mask it off instead. */
  assert((newanimindex & ~R) < 24);
  animB = vischar->animbase[newanimindex & ~R]; /* animbase is always &animations[0] */
  vischar->anim = animB;
  if ((newanimindex & R) == 0)
  {
    vischar->animindex = 0;
    vischar->direction = animB->to;
    frameB = &animB->frames[0]; // theoretically a no-op
    SWAP(const animframe_t *, frameB, frameA);
    goto forwards;
  }
  else
  {
    const animframe_t *stacked;

    length = animB->nframes;
    /* BUG FIX: (length - 1) used here, not length. */
    vischar->animindex = (length - 1) | vischar_ANIMINDEX_REVERSE;
    vischar->direction = animB->from;
    /* BUG FIX: Final frame used here, not first. */
    frameB = &animB->frames[length - 1];
    stacked = frameB;
    SWAP(const animframe_t *, frameB, frameA);
    spriteindex = animB->frames[length - 1].spriteindex;
    SWAP(spriteindex_t, spriteindex, spriteindex2);
    assert(frameA == stacked);
    frameA = stacked;
    goto backwards;
  }

#undef R
#undef F
}